

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result wabt::anon_unknown_1::CheckFuncTypeVarMatchesExplicit
                 (Location *loc,Module *module,FuncDeclaration *decl,Errors *errors)

{
  VarType VVar1;
  Result RVar2;
  Result RVar3;
  FuncType *pFVar4;
  Enum EVar5;
  Errors *in_R9;
  ErrorLevel local_54;
  string local_50;
  
  EVar5 = Ok;
  if (decl->has_func_type == true) {
    pFVar4 = Module::GetFuncType(module,&decl->type_var);
    if (pFVar4 == (FuncType *)0x0) {
      if (((decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
           _M_impl.super__Vector_impl_data._M_start !=
           (decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
           _M_impl.super__Vector_impl_data._M_finish) ||
         (EVar5 = Ok,
         (decl->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
         _M_impl.super__Vector_impl_data._M_start !=
         (decl->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
         _M_impl.super__Vector_impl_data._M_finish)) {
        VVar1 = (decl->type_var).type_;
        if (VVar1 == Index) {
          local_54 = Error;
          StringPrintf_abi_cxx11_
                    (&local_50,"invalid func type index %u",(ulong)(decl->type_var).field_2.index_);
        }
        else {
          local_54 = Error;
          if (VVar1 != Name) {
            __assert_fail("is_name()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/ir.h"
                          ,0x3e,"const std::string &wabt::Var::name() const");
          }
          StringPrintf_abi_cxx11_
                    (&local_50,"expected func type identifier %s",
                     (decl->type_var).field_2.name_._M_dataplus._M_p);
        }
        std::vector<wabt::Error,std::allocator<wabt::Error>>::
        emplace_back<wabt::ErrorLevel,wabt::Location_const&,std::__cxx11::string>
                  ((vector<wabt::Error,std::allocator<wabt::Error>> *)errors,&local_54,loc,&local_50
                  );
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        EVar5 = Error;
      }
    }
    else {
      RVar2 = CheckTypes(loc,&(decl->sig).result_types,&(pFVar4->sig).result_types,"result",
                         (char *)errors,in_R9);
      RVar3 = CheckTypes(loc,&(decl->sig).param_types,&(pFVar4->sig).param_types,"argument",
                         (char *)errors,in_R9);
      EVar5 = (uint)(RVar3.enum_ == Error || RVar2.enum_ == Error);
    }
  }
  return (Result)EVar5;
}

Assistant:

Result CheckFuncTypeVarMatchesExplicit(const Location& loc,
                                       const Module& module,
                                       const FuncDeclaration& decl,
                                       Errors* errors) {
  Result result = Result::Ok;
  if (decl.has_func_type) {
    const FuncType* func_type = module.GetFuncType(decl.type_var);
    if (func_type) {
      result |=
          CheckTypes(loc, decl.sig.result_types, func_type->sig.result_types,
                     "function", "result", errors);
      result |=
          CheckTypes(loc, decl.sig.param_types, func_type->sig.param_types,
                     "function", "argument", errors);
    } else if (!(decl.sig.param_types.empty() &&
                 decl.sig.result_types.empty())) {
      // We want to check whether the function type at the explicit index
      // matches the given param and result types. If they were omitted then
      // they'll be resolved automatically (see
      // ResolveFuncTypeWithEmptySignature), but if they are provided then we
      // have to check. If we get here then the type var is invalid, so we
      // can't check whether they match.
      if (decl.type_var.is_index()) {
        errors->emplace_back(ErrorLevel::Error, loc,
                             StringPrintf("invalid func type index %" PRIindex,
                                          decl.type_var.index()));
      } else {
        errors->emplace_back(ErrorLevel::Error, loc,
                             StringPrintf("expected func type identifier %s",
                                          decl.type_var.name().c_str()));
      }
      result = Result::Error;
    }
  }
  return result;
}